

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  bool *v1;
  bool *v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  Extension *local_60;
  bool local_49;
  LogMessageFatal local_30 [21];
  Voidify local_1b;
  bool local_1a;
  bool local_19;
  string *local_18;
  string *absl_log_internal_check_op_result;
  Extension *this_local;
  
  local_19 = (bool)(this->field_0xa & 1);
  absl_log_internal_check_op_result = (string *)this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_19);
  local_49 = true;
  if ((this->is_repeated & 1U) == 0) {
    local_49 = FieldTypeIsPointer(this->type);
  }
  local_1a = local_49;
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_1a);
  local_18 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                       (v1,v2,"is_pointer == is_repeated || FieldTypeIsPointer(type)");
  if (local_18 == (string *)0x0) {
    local_60 = this;
    if ((this->field_0xa & 1) != 0) {
      local_60 = (Extension *)
                 absl::lts_20240722::
                 bit_cast<const_void_*,_google::protobuf::internal::ExtensionSet::Extension::Pointer,_0>
                           ((Pointer *)this);
    }
    return local_60;
  }
  auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.h"
             ,0x2ab,auVar2._0_8_,auVar2._8_8_);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_1b,pLVar1);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }